

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::DefaultPrintTo<std::vector<int,std::allocator<int>>>
               (vector<int,_std::allocator<int>_> *param_1,ostream *param_2)

{
  bool bVar1;
  reference value;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  const_iterator it;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  vector<int,_std::allocator<int>_> *container_local;
  
  std::operator<<(param_2,'{');
  it._M_current = (int *)0x0;
  local_38._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(param_1);
  do {
    local_40._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(param_1);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
    if (!bVar1) {
LAB_00119c68:
      if (it._M_current != (int *)0x0) {
        std::operator<<(param_2,' ');
      }
      std::operator<<(param_2,'}');
      return;
    }
    if ((it._M_current != (int *)0x0) &&
       (std::operator<<(param_2,','), it._M_current == (int *)0x20)) {
      std::operator<<(param_2," ...");
      goto LAB_00119c68;
    }
    std::operator<<(param_2,' ');
    value = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
            operator*(&local_38);
    UniversalPrint<int>(value,param_2);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_38);
    it._M_current = it._M_current + 1;
  } while( true );
}

Assistant:

void DefaultPrintTo(WrapPrinterType<kPrintContainer> /* dummy */,
                    const C& container, ::std::ostream* os) {
  const size_t kMaxCount = 32;  // The maximum number of elements to print.
  *os << '{';
  size_t count = 0;
  for (typename C::const_iterator it = container.begin();
       it != container.end(); ++it, ++count) {
    if (count > 0) {
      *os << ',';
      if (count == kMaxCount) {  // Enough has been printed.
        *os << " ...";
        break;
      }
    }
    *os << ' ';
    // We cannot call PrintTo(*it, os) here as PrintTo() doesn't
    // handle *it being a native array.
    internal::UniversalPrint(*it, os);
  }

  if (count > 0) {
    *os << ' ';
  }
  *os << '}';
}